

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_bfext_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 retval;
  uint16_t uVar1;
  uintptr_t o_2;
  TCGv_i32 arg2;
  TCGv_i32 arg4;
  TCGv_i32 arg3;
  TCGv_i64 arg;
  uintptr_t o_3;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  retval = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(uVar1 >> 9 & 0x38));
  arg2 = gen_lea(env,s,insn,7);
  if (arg2 != tcg_ctx->NULL_QREG) {
    if ((uVar1 & 0x20) == 0) {
      arg4 = tcg_const_i32_m68k(tcg_ctx,uVar1 & 0x1f);
    }
    else {
      arg4 = tcg_ctx->cpu_dregs[uVar1 & 7];
    }
    if ((uVar1 >> 0xb & 1) == 0) {
      arg3 = tcg_const_i32_m68k(tcg_ctx,uVar1 >> 6 & 0x1f);
    }
    else {
      arg3 = tcg_ctx->cpu_dregs[uVar1 >> 6 & 7];
    }
    if ((insn >> 9 & 1) == 0) {
      arg = tcg_temp_new_i64(tcg_ctx);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_50 = arg2 + (long)tcg_ctx;
      local_48 = arg3 + (long)&tcg_ctx->pool_cur;
      local_40 = arg4 + (long)tcg_ctx;
      tcg_gen_callN_m68k(tcg_ctx,helper_bfextu_mem_m68k,(TCGTemp *)(arg + (long)&tcg_ctx->pool_cur),
                         4,&local_58);
      tcg_gen_extr_i64_i32_m68k(tcg_ctx,retval,QREG_CC_N,arg);
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(arg + (long)&tcg_ctx->pool_cur));
    }
    else {
      gen_helper_bfexts_mem(tcg_ctx,retval,tcg_ctx->cpu_env,arg2,arg3,arg4);
      tcg_gen_mov_i32(tcg_ctx,QREG_CC_N,retval);
    }
    set_cc_op(s,CC_OP_LOGIC);
    if ((uVar1 & 0x20) == 0) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(arg4 + (long)tcg_ctx));
    }
    if ((uVar1 >> 0xb & 1) == 0) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
    }
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(bfext_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    int is_sign = insn & 0x200;
    TCGv dest = DREG(ext, 12);
    TCGv addr, len, ofs;

    addr = gen_lea(env, s, insn, OS_UNSIZED);
    if (IS_NULL_QREG(addr)) {
        gen_addr_fault(s);
        return;
    }

    if (ext & 0x20) {
        len = DREG(ext, 0);
    } else {
        len = tcg_const_i32(tcg_ctx, extract32(ext, 0, 5));
    }
    if (ext & 0x800) {
        ofs = DREG(ext, 6);
    } else {
        ofs = tcg_const_i32(tcg_ctx, extract32(ext, 6, 5));
    }

    if (is_sign) {
        gen_helper_bfexts_mem(tcg_ctx, dest, tcg_ctx->cpu_env, addr, ofs, len);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_N, dest);
    } else {
        TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
        gen_helper_bfextu_mem(tcg_ctx, tmp, tcg_ctx->cpu_env, addr, ofs, len);
        tcg_gen_extr_i64_i32(tcg_ctx, dest, QREG_CC_N, tmp);
        tcg_temp_free_i64(tcg_ctx, tmp);
    }
    set_cc_op(s, CC_OP_LOGIC);

    if (!(ext & 0x20)) {
        tcg_temp_free(tcg_ctx, len);
    }
    if (!(ext & 0x800)) {
        tcg_temp_free(tcg_ctx, ofs);
    }
}